

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

string * lest::to_string<(anonymous_namespace)::State>(string *__return_storage_ptr__,State *value)

{
  uint *puVar1;
  ostringstream os;
  ulong *local_1d0;
  size_type local_1c8;
  ulong local_1c0;
  undefined8 uStack_1b8;
  ulong *local_1b0;
  size_type local_1a8;
  undefined1 local_1a0;
  undefined7 uStack_19f;
  undefined8 uStack_198;
  long local_190 [3];
  uint auStack_178 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  puVar1 = (uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  std::ostream::operator<<((ostream *)local_190,*value);
  std::__cxx11::ostringstream::str();
  if (local_1b0 == (ulong *)&local_1a0) {
    uStack_1b8 = uStack_198;
    local_1d0 = &local_1c0;
  }
  else {
    local_1d0 = local_1b0;
  }
  local_1c0 = CONCAT71(uStack_19f,local_1a0);
  local_1c8 = local_1a8;
  local_1a8 = 0;
  local_1a0 = 0;
  local_1b0 = (ulong *)&local_1a0;
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_1d0 == &local_1c0) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_1c0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_1b8;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1d0;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_1c0;
  }
  __return_storage_ptr__->_M_string_length = local_1c8;
  local_1c8 = 0;
  local_1c0 = local_1c0 & 0xffffffffffffff00;
  local_1d0 = &local_1c0;
  std::__cxx11::string::~string((string *)&local_1d0);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string( T const & value )
{
    return string_maker<T>::to_string( value );
}